

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::ParsedIR::get_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  Decoration *pDVar1;
  bool bVar2;
  Meta *pMVar3;
  ulong uVar4;
  BuiltIn BVar5;
  
  pMVar3 = find_meta(this,(ID)id.id);
  BVar5 = BuiltInPosition;
  if ((pMVar3 != (Meta *)0x0) &&
     (uVar4 = (ulong)index,
     uVar4 < (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size)) {
    pDVar1 = (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    bVar2 = Bitset::get(&pDVar1[uVar4].decoration_flags,decoration);
    BVar5 = BuiltInPosition;
    if (bVar2) {
      BVar5 = BuiltInPointSize;
      switch(decoration) {
      case DecorationStream:
        BVar5 = pDVar1[uVar4].stream;
        break;
      case DecorationLocation:
        BVar5 = pDVar1[uVar4].location;
        break;
      case DecorationComponent:
        BVar5 = pDVar1[uVar4].component;
        break;
      case DecorationIndex:
        BVar5 = pDVar1[uVar4].index;
        break;
      case DecorationBinding:
        BVar5 = pDVar1[uVar4].binding;
        break;
      case DecorationDescriptorSet:
        break;
      case DecorationOffset:
        BVar5 = pDVar1[uVar4].offset;
        break;
      case DecorationXfbBuffer:
        BVar5 = pDVar1[uVar4].xfb_buffer;
        break;
      case DecorationXfbStride:
        BVar5 = pDVar1[uVar4].xfb_stride;
        break;
      default:
        if (decoration == DecorationSpecId) {
          BVar5 = pDVar1[uVar4].spec_id;
        }
        else if (decoration == DecorationBuiltIn) {
          BVar5 = pDVar1[uVar4].builtin_type;
        }
      }
    }
  }
  return BVar5;
}

Assistant:

uint32_t ParsedIR::get_member_decoration(TypeID id, uint32_t index, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (!m)
		return 0;

	if (index >= m->members.size())
		return 0;

	auto &dec = m->members[index];
	if (!dec.decoration_flags.get(decoration))
		return 0;

	switch (decoration)
	{
	case DecorationBuiltIn:
		return dec.builtin_type;
	case DecorationLocation:
		return dec.location;
	case DecorationComponent:
		return dec.component;
	case DecorationBinding:
		return dec.binding;
	case DecorationOffset:
		return dec.offset;
	case DecorationXfbBuffer:
		return dec.xfb_buffer;
	case DecorationXfbStride:
		return dec.xfb_stride;
	case DecorationStream:
		return dec.stream;
	case DecorationSpecId:
		return dec.spec_id;
	case DecorationIndex:
		return dec.index;
	default:
		return 1;
	}
}